

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeWithCachedSizesBody(google::
protobuf::io::Printer*)::LazySerializerEmitter::Emit(google::protobuf::FieldDescriptor_const__
          (void *this,FieldDescriptor *field)

{
  int iVar1;
  long lVar2;
  iterator __position;
  Printer *pPVar3;
  bool bVar4;
  int iVar5;
  OneofDescriptor *pOVar6;
  OneofDescriptor *pOVar7;
  FieldDescriptor **ppFVar8;
  int new_index;
  anon_class_1_0_00000001 local_115;
  int local_114;
  FieldDescriptor *local_110;
  string local_108;
  Sub local_e8;
  
  local_110 = field;
  bVar4 = FieldDescriptor::has_presence(field);
  if (bVar4) {
    if (*(long **)((long)this + 0x10) != *(long **)((long)this + 0x18)) {
      lVar2 = **(long **)((long)this + 0x10);
      if ((*(byte *)(lVar2 + 1) & 0x10) == 0) {
        pOVar6 = (OneofDescriptor *)0x0;
      }
      else {
        pOVar6 = *(OneofDescriptor **)(lVar2 + 0x28);
        if (pOVar6 == (OneofDescriptor *)0x0) goto LAB_00dcb899;
      }
      if ((field->field_0x1 & 0x10) == 0) {
        pOVar7 = (OneofDescriptor *)0x0;
      }
      else {
        pOVar7 = (field->scope_).containing_oneof;
        if (pOVar7 == (OneofDescriptor *)0x0) goto LAB_00dcb899;
      }
      if (pOVar6 != pOVar7) goto LAB_00dcb697;
    }
  }
  else {
LAB_00dcb697:
    GenerateSerializeWithCachedSizesBody::LazySerializerEmitter::Flush
              ((LazySerializerEmitter *)this);
  }
  if ((field->field_0x3 & 1) == 0) {
    bVar4 = protobuf::internal::cpp::HasHasbit(field);
    if ((bVar4) && (bVar4 = FieldDescriptor::has_presence(field), bVar4)) {
      if ((field->field_0x1 & 8) == 0) {
        ppFVar8 = &field->containing_type_->fields_;
      }
      else if ((field->scope_).extension_scope == (Descriptor *)0x0) {
        ppFVar8 = &field->file_->extensions_;
      }
      else {
        ppFVar8 = &((field->scope_).extension_scope)->extensions_;
      }
      iVar1 = *(int *)(*(long *)(*this + 0x120) +
                      (long)((int)((ulong)((long)field - (long)*ppFVar8) >> 3) * -0x45d1745d) * 4);
      iVar5 = iVar1 + 0x1f;
      if (-1 < iVar1) {
        iVar5 = iVar1;
      }
      if (*(int *)((long)this + 0x28) != iVar5 >> 5) {
        pPVar3 = *(Printer **)((long)this + 8);
        local_114 = iVar5 >> 5;
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"index","");
        protobuf::io::Printer::Sub::Sub<int&>(&local_e8,&local_108,&local_114);
        protobuf::io::Printer::Emit
                  (pPVar3,&local_e8,1,0x61,
                   "\n                       cached_has_bits = this_._impl_._has_bits_[$index$];\n                     "
                  );
        if (local_e8.annotation_.
            super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>.
            _M_payload.
            super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>
            .super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>.
            _M_engaged == true) {
          std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                    ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                     &local_e8.annotation_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8.value_.consume_after._M_dataplus._M_p !=
            &local_e8.value_.consume_after.field_2) {
          operator_delete(local_e8.value_.consume_after._M_dataplus._M_p,
                          local_e8.value_.consume_after.field_2._M_allocated_capacity + 1);
        }
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
          ::_S_vtable._M_arr
          [local_e8.value_.value.
           super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
           .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
           super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
           super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
           super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
           super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
           _M_index]._M_data)(&local_115,&local_e8.value_.value);
        local_e8.value_.value.
        super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
        .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
        super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
        super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
        super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
        super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
        _M_index = 0xff;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8.key_._M_dataplus._M_p != &local_e8.key_.field_2) {
          operator_delete(local_e8.key_._M_dataplus._M_p,
                          local_e8.key_.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        *(int *)((long)this + 0x28) = local_114;
      }
    }
    GenerateSerializeOneField(*this,*(Printer **)((long)this + 8),field,*(int *)((long)this + 0x28))
    ;
    return;
  }
  if ((field->field_0x1 & 0x10) == 0) {
    protobuf::internal::protobuf_assumption_failed
              ("res != nullptr",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
               ,0xb63);
  }
  pOVar6 = (field->scope_).containing_oneof;
  if (pOVar6 != (OneofDescriptor *)0x0) {
    if ((pOVar6->field_count_ != 1) || ((pOVar6->fields_->field_0x1 & 2) == 0)) {
      __position._M_current = *(FieldDescriptor ***)((long)this + 0x18);
      if (__position._M_current != *(FieldDescriptor ***)((long)this + 0x20)) {
        *__position._M_current = field;
        *(long *)((long)this + 0x18) = *(long *)((long)this + 0x18) + 8;
        return;
      }
      std::
      vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
      ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                  *)((long)this + 0x10),__position,&local_110);
      return;
    }
    FieldDescriptor_const____clone__cold_1_();
  }
LAB_00dcb899:
  protobuf::internal::protobuf_assumption_failed
            ("res != nullptr",
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
             ,0xb31);
}

Assistant:

void Emit(const FieldDescriptor* field) {
      if (!field->has_presence() || MustFlush(field)) {
        Flush();
      }
      if (field->real_containing_oneof()) {
        v_.push_back(field);
      } else {
        // TODO: Defer non-oneof fields similarly to oneof fields.
        if (HasHasbit(field) && field->has_presence()) {
          // We speculatively load the entire _has_bits_[index] contents, even
          // if it is for only one field.  Deferring non-oneof emitting would
          // allow us to determine whether this is going to be useful.
          int has_bit_index = mg_->has_bit_indices_[field->index()];
          if (cached_has_bit_index_ != has_bit_index / 32) {
            // Reload.
            int new_index = has_bit_index / 32;
            p_->Emit({{"index", new_index}},
                     R"cc(
                       cached_has_bits = this_._impl_._has_bits_[$index$];
                     )cc");
            cached_has_bit_index_ = new_index;
          }
        }

        mg_->GenerateSerializeOneField(p_, field, cached_has_bit_index_);
      }
    }